

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O3

void __thiscall llama_context::kv_self_update(llama_context *this)

{
  uint uVar1;
  long lVar2;
  long *plVar3;
  undefined1 auVar4 [16];
  char cVar5;
  bool bVar6;
  ggml_cgraph *pgVar7;
  size_t sVar8;
  llama_ubatch *ubatch;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  pointer *__ptr;
  int32_t n_max_nodes;
  llama_kv_cache_unified *plVar12;
  bool bVar13;
  int iVar15;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  llama_token token;
  undefined1 local_78 [20];
  uint32_t uStack_64;
  uint local_60;
  int local_5c;
  undefined1 *local_58;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  undefined8 local_30;
  
  plVar12 = (this->kv_self)._M_t.
            super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
            ._M_t.
            super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
            .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl;
  if (plVar12->has_shift == true) {
    cVar5 = (**(code **)((long)(plVar12->super_llama_kv_cache).super_llama_memory_i + 0x68))();
    if (cVar5 == '\0') {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                 ,0x2ec,"The current context does not support K-shift");
    }
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: applying K-shift\n","kv_self_update");
    bVar13 = (this->model->hparams).rope_type != LLAMA_ROPE_TYPE_NONE;
    if (bVar13) {
      ggml_backend_sched_reset
                ((this->sched)._M_t.
                 super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                 super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                 super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl);
      pgVar7 = graph_init(this);
      build_kv_self_shift((llama_context *)(local_78 + 0x10),(ggml_context *)this,
                          (ggml_cgraph *)
                          (this->ctx_compute)._M_t.
                          super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                          super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                          super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl);
      ggml_backend_sched_alloc_graph
                ((this->sched)._M_t.
                 super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                 super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                 super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl,pgVar7);
      plVar3 = (long *)CONCAT44(uStack_64,local_78._16_4_);
      (**(code **)(*plVar3 + 0x28))(plVar3,0);
      graph_compute(this,pgVar7,false);
      (**(code **)(*plVar3 + 8))(plVar3);
    }
    plVar12 = (this->kv_self)._M_t.
              super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
              ._M_t.
              super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
              .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl;
    plVar12->has_shift = false;
    auVar4 = _DAT_002350d0;
    uVar9 = (ulong)plVar12->size;
    if (uVar9 != 0) {
      lVar2 = *(long *)&(plVar12->cells).
                        super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>._M_impl.
                        super__Vector_impl_data;
      lVar10 = uVar9 - 1;
      auVar14._8_4_ = (int)lVar10;
      auVar14._0_8_ = lVar10;
      auVar14._12_4_ = (int)((ulong)lVar10 >> 0x20);
      uVar11 = 0;
      auVar14 = auVar14 ^ _DAT_002350d0;
      auVar16 = _DAT_002350b0;
      auVar17 = _DAT_002350c0;
      do {
        auVar18 = auVar17 ^ auVar4;
        iVar15 = auVar14._4_4_;
        if ((bool)(~(auVar18._4_4_ == iVar15 && auVar14._0_4_ < auVar18._0_4_ ||
                    iVar15 < auVar18._4_4_) & 1)) {
          *(undefined4 *)(lVar2 + 4 + uVar11) = 0;
        }
        if ((auVar18._12_4_ != auVar14._12_4_ || auVar18._8_4_ <= auVar14._8_4_) &&
            auVar18._12_4_ <= auVar14._12_4_) {
          *(undefined4 *)(lVar2 + 0x44 + uVar11) = 0;
        }
        auVar18 = auVar16 ^ auVar4;
        iVar19 = auVar18._4_4_;
        if (iVar19 <= iVar15 && (iVar19 != iVar15 || auVar18._0_4_ <= auVar14._0_4_)) {
          *(undefined4 *)(lVar2 + 0x84 + uVar11) = 0;
          *(undefined4 *)(lVar2 + 0xc4 + uVar11) = 0;
        }
        lVar10 = auVar17._8_8_;
        auVar17._0_8_ = auVar17._0_8_ + 4;
        auVar17._8_8_ = lVar10 + 4;
        lVar10 = auVar16._8_8_;
        auVar16._0_8_ = auVar16._0_8_ + 4;
        auVar16._8_8_ = lVar10 + 4;
        uVar11 = uVar11 + 0x100;
      } while ((uVar9 * 0x40 + 0xc0 & 0xffffffffffffff00) != uVar11);
    }
  }
  else {
    bVar13 = false;
  }
  if (plVar12->do_defrag == true) {
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: defragmenting KV cache\n","kv_self_update");
    plVar12 = (this->kv_self)._M_t.
              super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
              ._M_t.
              super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
              .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl;
    sVar8 = llama_model::n_tensors(this->model);
    iVar15 = (int)sVar8 * 5;
    n_max_nodes = 0x10000;
    if (0x10000 < iVar15) {
      n_max_nodes = iVar15;
    }
    bVar6 = llama_kv_cache_unified::defrag_prepare(plVar12,n_max_nodes);
    if (bVar6) {
      ggml_backend_sched_reset
                ((this->sched)._M_t.
                 super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                 super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                 super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl);
      pgVar7 = graph_init(this);
      build_kv_self_defrag
                ((llama_context *)(local_78 + 0x10),(ggml_context *)this,
                 (ggml_cgraph *)
                 (this->ctx_compute)._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
                 _M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                 super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl);
      ggml_backend_sched_alloc_graph
                ((this->sched)._M_t.
                 super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                 super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                 super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl,pgVar7);
      plVar3 = (long *)CONCAT44(uStack_64,local_78._16_4_);
      (**(code **)(*plVar3 + 0x28))(plVar3,0);
      graph_compute(this,pgVar7,false);
      (**(code **)(*plVar3 + 8))(plVar3);
      ((this->kv_self)._M_t.
       super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>.
       _M_t.
       super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
       .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl)->do_defrag = false;
      goto LAB_0018efae;
    }
    ((this->kv_self)._M_t.
     super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>.
     _M_t.
     super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>.
     super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl)->do_defrag = false;
  }
  if (!bVar13) {
    return;
  }
LAB_0018efae:
  llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: reserving a worst case graph\n","kv_self_update");
  uStack_64 = (this->cparams).n_ctx;
  uVar1 = (this->cparams).n_ubatch;
  if (uVar1 < uStack_64) {
    uStack_64 = uVar1;
  }
  plVar12 = (this->kv_self)._M_t.
            super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
            ._M_t.
            super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
            .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl;
  plVar12->n = plVar12->size;
  local_78._12_4_ = llama_vocab::token_bos(&this->model->vocab);
  local_58 = local_78 + 0xc;
  local_78[0x10] = 1;
  local_5c = 1;
  local_50 = (undefined1  [16])0x0;
  local_40 = (undefined1  [16])0x0;
  local_30._0_4_ = LLAMA_POOLING_TYPE_NONE;
  local_30._4_4_ = 0;
  local_60 = uStack_64;
  ubatch = (llama_ubatch *)graph_init(this);
  graph_build((llama_context *)local_78,(ggml_context *)this,
              (ggml_cgraph *)
              (this->ctx_compute)._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
              _M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,ubatch,(int)local_78 + 0x10)
  ;
  if ((llama_model *)local_78._0_8_ != (llama_model *)0x0) {
    (**(code **)(*(long *)local_78._0_8_ + 8))();
  }
  local_78._0_8_ = (llama_model *)0x0;
  ggml_backend_sched_reset
            ((this->sched)._M_t.
             super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
             super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
             super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl);
  cVar5 = ggml_backend_sched_reserve
                    ((this->sched)._M_t.
                     super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                     super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                     super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl,ubatch);
  if (cVar5 == '\0') {
    llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to allocate compute buffers\n",
                       "kv_self_update");
  }
  return;
}

Assistant:

void llama_context::kv_self_update() {
    auto & kv = kv_self;

    bool need_reserve = false;

    if (kv->has_shift) {
        if (!kv->get_can_shift()) {
            GGML_ABORT("The current context does not support K-shift");
        }

        LLAMA_LOG_DEBUG("%s: applying K-shift\n", __func__);

        // apply K-shift if needed
        if (model.hparams.rope_type != LLAMA_ROPE_TYPE_NONE) {
            ggml_backend_sched_reset(sched.get());

            auto * gf = graph_init();

            auto res = build_kv_self_shift(ctx_compute.get(), gf);

            ggml_backend_sched_alloc_graph(sched.get(), gf);

            res->set_inputs(nullptr);

            graph_compute(gf, false);

            need_reserve = true;
        }

        {
            kv->has_shift = false;

            for (uint32_t i = 0; i < kv->size; ++i) {
                kv->cells[i].delta = 0;
            }
        }
    }

    // defragment the KV cache if needed
    if (kv->do_defrag) {
        LLAMA_LOG_DEBUG("%s: defragmenting KV cache\n", __func__);

        if (kv->defrag_prepare(graph_max_nodes())) {
            ggml_backend_sched_reset(sched.get());

            auto * gf = graph_init();

            auto res = build_kv_self_defrag(ctx_compute.get(), gf);

            ggml_backend_sched_alloc_graph(sched.get(), gf);

            res->set_inputs(nullptr);

            graph_compute(gf, false);

            need_reserve = true;
        }

        kv->do_defrag = false;
    }

    // reserve a worst case graph if needed
    if (need_reserve) {
        LLAMA_LOG_DEBUG("%s: reserving a worst case graph\n", __func__);

        // build worst-case graph
        uint32_t n_seqs = 1; // TODO: worst-case number of sequences
        uint32_t n_tokens = std::min(cparams.n_ctx, cparams.n_ubatch);

        // simulate full KV cache
        kv_self->n = kv_self->size;

        llama_token token = model.vocab.token_bos(); // not actually used by llama_build_graph, but required to choose between token and embedding inputs graph
        llama_ubatch ubatch = { true, n_tokens, n_tokens / n_seqs, n_seqs, &token, nullptr, nullptr, nullptr, nullptr, nullptr};

        auto * gf = graph_init();
        graph_build(ctx_compute.get(), gf, ubatch, LLM_GRAPH_TYPE_DEFAULT);

        // initialize scheduler with the worst-case graph
        ggml_backend_sched_reset(sched.get());
        if (!ggml_backend_sched_reserve(sched.get(), gf)) {
            LLAMA_LOG_ERROR("%s: failed to allocate compute buffers\n", __func__);
        }
    }
}